

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_descriptor_set_layout
          (Impl *this,VkDescriptorSetLayoutCreateInfo *create_info,ScratchAllocator *alloc,
          VkDescriptorSetLayoutCreateInfo **out_create_info)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  void *pvVar2;
  uint32_t uVar3;
  VkStructureType VVar4;
  undefined4 uVar5;
  bool bVar6;
  VkDescriptorSetLayoutCreateInfo *pVVar7;
  VkDescriptorSetLayoutBinding *__dest;
  void *__dest_00;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  
  pVVar7 = (VkDescriptorSetLayoutCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (pVVar7 != (VkDescriptorSetLayoutCreateInfo *)0x0) {
    VVar4 = create_info->sType;
    uVar5 = *(undefined4 *)&create_info->field_0x4;
    pvVar2 = create_info->pNext;
    uVar3 = create_info->bindingCount;
    pVVar1 = create_info->pBindings;
    pVVar7->flags = create_info->flags;
    pVVar7->bindingCount = uVar3;
    pVVar7->pBindings = pVVar1;
    pVVar7->sType = VVar4;
    *(undefined4 *)&pVVar7->field_0x4 = uVar5;
    pVVar7->pNext = pvVar2;
  }
  if ((ulong)pVVar7->bindingCount == 0) {
    pVVar7->pBindings = (VkDescriptorSetLayoutBinding *)0x0;
  }
  else {
    pVVar1 = pVVar7->pBindings;
    sVar9 = (ulong)pVVar7->bindingCount * 0x18;
    __dest = (VkDescriptorSetLayoutBinding *)ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
    if (__dest != (VkDescriptorSetLayoutBinding *)0x0) {
      memmove(__dest,pVVar1,sVar9);
    }
    pVVar7->pBindings = __dest;
    if (pVVar7->bindingCount != 0) {
      lVar10 = 0x10;
      uVar11 = 0;
      do {
        pVVar1 = pVVar7->pBindings;
        pvVar2 = *(void **)((long)&pVVar1->binding + lVar10);
        if (((pvVar2 == (void *)0x0) || (1 < *(uint *)((long)pVVar1 + lVar10 + -0xc))) ||
           (uVar8 = (ulong)*(uint *)((long)pVVar1 + lVar10 + -8), uVar8 == 0)) {
          __dest_00 = (void *)0x0;
        }
        else {
          sVar9 = uVar8 << 3;
          __dest_00 = ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
          if (__dest_00 == (void *)0x0) {
            __dest_00 = (void *)0x0;
          }
          else {
            memmove(__dest_00,pvVar2,sVar9);
          }
        }
        *(void **)((long)&pVVar1->binding + lVar10) = __dest_00;
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x18;
      } while (uVar11 < pVVar7->bindingCount);
    }
  }
  bVar6 = copy_pnext_chain(this,create_info->pNext,alloc,&pVVar7->pNext,(DynamicStateInfo *)0x0,0);
  if (bVar6) {
    *out_create_info = pVVar7;
  }
  return bVar6;
}

Assistant:

bool StateRecorder::Impl::copy_descriptor_set_layout(
	const VkDescriptorSetLayoutCreateInfo *create_info, ScratchAllocator &alloc,
	VkDescriptorSetLayoutCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pBindings = copy(info->pBindings, info->bindingCount, alloc);

	for (uint32_t i = 0; i < info->bindingCount; i++)
	{
		auto &b = const_cast<VkDescriptorSetLayoutBinding &>(info->pBindings[i]);
		if (b.pImmutableSamplers &&
		    (b.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER ||
		     b.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER))
		{
			b.pImmutableSamplers = copy(b.pImmutableSamplers, b.descriptorCount, alloc);
		}
		else
		{
			b.pImmutableSamplers = nullptr;
		}
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}